

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall
helics::apps::WebServer::mainLoop(WebServer *this,shared_ptr<helics::apps::WebServer> *keepAlive)

{
  string *psVar1;
  basic_endpoint<boost::asio::ip::tcp> *pbVar2;
  bool bVar3;
  bool bVar4;
  const_reference pvVar5;
  InterfaceNetworks IVar6;
  address address;
  io_context local_60;
  bool external;
  
  if (this->mHttpEnabled == true) {
    IVar6 = (InterfaceNetworks)this->mInterfaceNetwork;
    bVar3 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[5],_0>(this->config,(char (*) [5])0x374811);
    if (bVar3) {
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)this->config,"http");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"interface",(allocator<char> *)&external);
      fileops::replaceIfMember(pvVar5,(string *)&address,&this->mHttpAddress);
      std::__cxx11::string::~string((string *)&address);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"port",(allocator<char> *)&external);
      fileops::replaceIfMember(pvVar5,(string *)&address,&this->mHttpPort);
      std::__cxx11::string::~string((string *)&address);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"ipv4",(allocator<char> *)&external);
      bVar3 = fileops::getOrDefault(pvVar5,(string *)&address,false);
      std::__cxx11::string::~string((string *)&address);
      if (bVar3) {
        IVar6 = IPV4;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"ipv6",(allocator<char> *)&external);
      bVar4 = fileops::getOrDefault(pvVar5,(string *)&address,false);
      std::__cxx11::string::~string((string *)&address);
      if (bVar4) {
        IVar6 = bVar3 * '\x04' + IPV6;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"external",(allocator<char> *)&local_60);
      bVar3 = fileops::getOrDefault(pvVar5,(string *)&address,false);
      std::__cxx11::string::~string((string *)&address);
      external = bVar3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"all",(allocator<char> *)&local_60);
      fileops::replaceIfMember(pvVar5,(string *)&address,&external);
      std::__cxx11::string::~string((string *)&address);
      if (external != false) {
        IVar6 = ALL;
      }
    }
    psVar1 = &this->mHttpAddress;
    gmlc::networking::generateMatchingInterfaceAddress((string *)&address,(string *)psVar1,IVar6);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address)
    ;
    std::__cxx11::string::~string((string *)&address);
    gmlc::networking::removeProtocol((string *)psVar1);
    bVar3 = std::operator==(psVar1,"*");
    if (bVar3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (psVar1,"0.0.0.0");
    }
    boost::asio::ip::make_address(&address,psVar1);
    pbVar2 = (basic_endpoint<boost::asio::ip::tcp> *)
             (this->context).
             super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    boost::asio::ip::detail::endpoint::endpoint
              ((endpoint *)&external,&address,(unsigned_short)this->mHttpPort);
    std::
    make_shared<Listener,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
              (&local_60,pbVar2);
    Listener::do_accept((Listener *)local_60.super_execution_context.service_registry_);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.impl_);
  }
  if (this->mWebsocketEnabled == true) {
    IVar6 = (InterfaceNetworks)this->mInterfaceNetwork;
    bVar3 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[10],_0>(this->config,(char (*) [10])0x37125e);
    if (bVar3) {
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)this->config,"websocket");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"interface",(allocator<char> *)&external);
      fileops::replaceIfMember(pvVar5,(string *)&address,&this->mWebsocketAddress);
      std::__cxx11::string::~string((string *)&address);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"port",(allocator<char> *)&external);
      fileops::replaceIfMember(pvVar5,(string *)&address,&this->mWebsocketPort);
      std::__cxx11::string::~string((string *)&address);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"ipv4",(allocator<char> *)&external);
      bVar3 = fileops::getOrDefault(pvVar5,(string *)&address,false);
      std::__cxx11::string::~string((string *)&address);
      if (bVar3) {
        IVar6 = IPV4;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"ipv6",(allocator<char> *)&external);
      bVar4 = fileops::getOrDefault(pvVar5,(string *)&address,false);
      std::__cxx11::string::~string((string *)&address);
      if (bVar4) {
        IVar6 = bVar3 * '\x04' + IPV6;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"external",(allocator<char> *)&local_60);
      bVar3 = fileops::getOrDefault(pvVar5,(string *)&address,false);
      std::__cxx11::string::~string((string *)&address);
      external = bVar3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&address,"all",(allocator<char> *)&local_60);
      fileops::replaceIfMember(pvVar5,(string *)&address,&external);
      std::__cxx11::string::~string((string *)&address);
      if (external != false) {
        IVar6 = ALL;
      }
    }
    psVar1 = &this->mWebsocketAddress;
    gmlc::networking::generateMatchingInterfaceAddress((string *)&address,(string *)psVar1,IVar6);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address)
    ;
    std::__cxx11::string::~string((string *)&address);
    gmlc::networking::removeProtocol((string *)psVar1);
    bVar3 = std::operator==(psVar1,"*");
    if (bVar3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (psVar1,"0.0.0.0");
    }
    boost::asio::ip::make_address(&address,psVar1);
    pbVar2 = (basic_endpoint<boost::asio::ip::tcp> *)
             (this->context).
             super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    boost::asio::ip::detail::endpoint::endpoint
              ((endpoint *)&external,&address,(unsigned_short)this->mWebsocketPort);
    std::
    make_shared<Listener,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,bool>
              (&local_60,pbVar2,&external);
    Listener::do_accept((Listener *)local_60.super_execution_context.service_registry_);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.impl_);
  }
  LOCK();
  (this->executing)._M_base._M_i = true;
  UNLOCK();
  if (((this->running)._M_base._M_i & 1U) != 0) {
    boost::asio::io_context::run
              (&((this->context).
                 super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                ioc);
  }
  LOCK();
  (this->executing)._M_base._M_i = false;
  UNLOCK();
  CLI::std::__shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>::reset
            (&keepAlive->super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void WebServer::mainLoop(std::shared_ptr<WebServer> keepAlive)
{
    if (mHttpEnabled) {
        auto httpInterfaceNetwork = mInterfaceNetwork;
        if (config->contains("http")) {
            const auto& httpConfig = (*config)["http"];
            helics::fileops::replaceIfMember(httpConfig, "interface", mHttpAddress);
            helics::fileops::replaceIfMember(httpConfig, "port", mHttpPort);
            const bool ipv4 = helics::fileops::getOrDefault(httpConfig, "ipv4", false);

            if (ipv4) {
                httpInterfaceNetwork = static_cast<int>(gmlc::networking::InterfaceNetworks::IPV4);
            }
            const bool ipv6 = helics::fileops::getOrDefault(httpConfig, "ipv6", false);
            if (ipv6) {
                httpInterfaceNetwork =
                    static_cast<int>((ipv4) ? gmlc::networking::InterfaceNetworks::ALL :
                                              gmlc::networking::InterfaceNetworks::IPV6);
            }

            bool external = helics::fileops::getOrDefault(httpConfig, "external", false);
            helics::fileops::replaceIfMember(httpConfig, "all", external);
            if (external) {
                httpInterfaceNetwork = static_cast<int>(gmlc::networking::InterfaceNetworks::ALL);
            }
        }
        mHttpAddress = gmlc::networking::generateMatchingInterfaceAddress(
            mHttpAddress, static_cast<gmlc::networking::InterfaceNetworks>(httpInterfaceNetwork));
        gmlc::networking::removeProtocol(mHttpAddress);
        if (mHttpAddress == "*") {
            mHttpAddress = "0.0.0.0";
        }
        auto const address = net::ip::make_address(mHttpAddress);
        // Create and launch a listening port
        std::make_shared<Listener>(context->ioc,
                                   tcp::endpoint{address, static_cast<std::uint16_t>(mHttpPort)})
            ->run();
    }

    if (mWebsocketEnabled) {
        auto websocketInterfaceNetwork = mInterfaceNetwork;
        if (config->contains("websocket")) {
            const auto& webConfig = (*config)["websocket"];
            helics::fileops::replaceIfMember(webConfig, "interface", mWebsocketAddress);
            helics::fileops::replaceIfMember(webConfig, "port", mWebsocketPort);

            const bool ipv4 = helics::fileops::getOrDefault(webConfig, "ipv4", false);

            if (ipv4) {
                websocketInterfaceNetwork =
                    static_cast<int>(gmlc::networking::InterfaceNetworks::IPV4);
            }
            const bool ipv6 = helics::fileops::getOrDefault(webConfig, "ipv6", false);
            if (ipv6) {
                websocketInterfaceNetwork =
                    static_cast<int>((ipv4) ? gmlc::networking::InterfaceNetworks::ALL :
                                              gmlc::networking::InterfaceNetworks::IPV6);
            }

            bool external = helics::fileops::getOrDefault(webConfig, "external", false);
            helics::fileops::replaceIfMember(webConfig, "all", external);
            if (external) {
                websocketInterfaceNetwork =
                    static_cast<int>(gmlc::networking::InterfaceNetworks::ALL);
            }
        }
        mWebsocketAddress = gmlc::networking::generateMatchingInterfaceAddress(
            mWebsocketAddress,
            static_cast<gmlc::networking::InterfaceNetworks>(websocketInterfaceNetwork));
        gmlc::networking::removeProtocol(mWebsocketAddress);
        if (mWebsocketAddress == "*") {
            mWebsocketAddress = "0.0.0.0";
        }
        auto const address = net::ip::make_address(mWebsocketAddress);
        // Create and launch a listening port
        std::make_shared<Listener>(context->ioc,
                                   tcp::endpoint{address,
                                                 static_cast<std::uint16_t>(mWebsocketPort)},
                                   true)
            ->run();
    }
    executing.store(true);
    // Run the I/O service
    if (running.load()) {
        context->ioc.run();
    }
    executing.store(false);
    keepAlive.reset();
}